

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O0

void generate_specialized_template<short>(short denom)

{
  ostream *poVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  short in_DI;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_98 [32];
  string local_78 [22];
  short in_stack_ffffffffffffff9e;
  string local_48 [32];
  string local_28 [38];
  short local_2;
  
  local_2 = in_DI;
  poVar1 = std::operator<<((ostream *)&std::cout,"template<> struct libdivide_constants");
  poVar1 = std::operator<<(poVar1,"<");
  pcVar2 = type_name<short>::get_name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2);
  poVar1 = std::operator<<(poVar1,"> ");
  poVar1 = std::operator<<(poVar1,"{ ");
  poVar1 = std::operator<<(poVar1,"static constexpr ");
  pcVar2 = struct_selector<short>::get_name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," libdivide = { ");
  poVar1 = std::operator<<(poVar1,".magic = ");
  const_macro_name<short>(in_stack_ffffffffffffff9e);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  poVar1 = std::operator<<(poVar1,local_28);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar1,".more = ");
  const_macro_name<short>(in_stack_ffffffffffffff9e);
  std::operator+(__lhs,in_stack_ffffffffffffff30);
  poVar1 = std::operator<<((ostream *)__lhs,local_78);
  std::operator<<(poVar1,"};\n");
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void generate_specialized_template(_IntT denom) {
    std::cout << "template<> struct libdivide_constants"
        << "<" << type_name<_IntT>::get_name() << "," << denom << "> "
        << "{ "
        << "static constexpr " << struct_selector<_IntT>::get_name() << " libdivide = { "
        <<              ".magic = " << const_macro_name(denom)+"_MAGIC, "
        <<              ".more = " <<  const_macro_name(denom)+"_MORE};"
        << "};\n";
}